

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

bool runtest<char>(char *inifile,char *expectedfile,basic_ostream<char,_std::char_traits<char>_> *os
                  )

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  int iVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  Ini<char> ini;
  basic_ifstream<char,_std::char_traits<char>_> is;
  allocator<char> local_479;
  long *local_478;
  size_t local_470;
  long local_468 [2];
  long *local_458;
  size_t local_450;
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  Ini<char> local_418;
  long local_3c0 [2];
  ostream local_3b0 [96];
  ios_base local_350 [16];
  ios_base local_340 [264];
  ifstream local_238 [16];
  streambuf local_228 [504];
  
  inipp::Ini<char>::Ini(&local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,inifile,(allocator<char> *)local_438);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c0);
  std::ifstream::ifstream(local_238,(string *)&local_478,_S_in);
  inipp::Ini<char>::parse(&local_418,(basic_istream<char,_std::char_traits<char>_> *)local_238);
  std::ifstream::~ifstream(local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c0,">>> ERRORS <<<",0xe);
  std::ios::widen((char)(ostream *)local_3c0 + (char)*(undefined8 *)(local_3c0[0] + -0x18));
  std::ostream::put((char)local_3c0);
  std::ostream::flush();
  this = &local_418.errors;
  if (local_418.errors.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
    p_Var3 = local_418.errors.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3c0,(char *)p_Var3[1]._M_next,(long)p_Var3[1]._M_prev);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c0,">>> GENERATE <<<",0x10);
  std::ios::widen((char)(ostream *)local_3c0 + (char)*(undefined8 *)(local_3c0[0] + -0x18));
  std::ostream::put((char)local_3c0);
  std::ostream::flush();
  inipp::Ini<char>::generate(&local_418,(basic_ostream<char,_std::char_traits<char>_> *)local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3c0,">>> INTERPOLATE <<<",0x13);
  std::ios::widen((char)(ostream *)local_3c0 + (char)*(undefined8 *)(local_3c0[0] + -0x18));
  std::ostream::put((char)local_3c0);
  std::ostream::flush();
  inipp::Ini<char>::interpolate(&local_418);
  inipp::Ini<char>::generate(&local_418,(basic_ostream<char,_std::char_traits<char>_> *)local_3c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c0);
  std::ios_base::~ios_base(local_350);
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_438,expectedfile,&local_479);
  std::ifstream::ifstream(local_238,(string *)local_438,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,(char *)local_458,local_450);
  if (local_450 == local_470) {
    if (local_450 == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp(local_458,local_478,local_450);
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  if (local_418.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_418.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&this->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)&local_418);
  return bVar4;
}

Assistant:

static inline bool runtest(const char *inifile, const char *expectedfile, std::basic_ostream<CharT> & os) {
	Ini<CharT> ini;
	auto actual = test(inifile, ini);
	auto expected = read_all<CharT>(expectedfile);
	os << actual;
	return (actual == expected);
}